

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
          (SourceLocationCommentPrinter *this,string *output)

{
  pointer pbVar1;
  string *leading_detached_comment;
  pointer comment_text;
  AlphaNum local_b0;
  string local_80;
  AlphaNum local_60;
  
  if (this->have_source_loc_ == true) {
    pbVar1 = (this->source_loc_).leading_detached_comments.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (comment_text = (this->source_loc_).leading_detached_comments.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; comment_text != pbVar1;
        comment_text = comment_text + 1) {
      FormatComment(&local_80,this,comment_text);
      local_60.piece_._M_len = local_80._M_string_length;
      local_60.piece_._M_str = local_80._M_dataplus._M_p;
      local_b0.piece_ = absl::lts_20250127::NullSafeStringView("\n");
      absl::lts_20250127::StrAppend(output,&local_60,&local_b0);
      std::__cxx11::string::~string((string *)&local_80);
    }
    if ((this->source_loc_).leading_comments._M_string_length != 0) {
      FormatComment((string *)&local_b0,this,&(this->source_loc_).leading_comments);
      local_60.piece_._M_len = (size_t)local_b0.piece_._M_str;
      local_60.piece_._M_str = (char *)local_b0.piece_._M_len;
      absl::lts_20250127::StrAppend(output,&local_60);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  return;
}

Assistant:

void AddPreComment(std::string* output) {
    if (have_source_loc_) {
      // Detached leading comments.
      for (const std::string& leading_detached_comment :
           source_loc_.leading_detached_comments) {
        absl::StrAppend(output, FormatComment(leading_detached_comment), "\n");
      }
      // Attached leading comments.
      if (!source_loc_.leading_comments.empty()) {
        absl::StrAppend(output, FormatComment(source_loc_.leading_comments));
      }
    }
  }